

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

bool QtPrivate::sequential_erase_one<QList<QAbstractFileEngineHandler*>,QAbstractFileEngineHandler*>
               (QList<QAbstractFileEngineHandler_*> *c,QAbstractFileEngineHandler **t)

{
  QAbstractFileEngineHandler **ppQVar1;
  QAbstractFileEngineHandler **ppQVar2;
  const_iterator abegin;
  
  ppQVar2 = (c->d).ptr;
  ppQVar1 = ppQVar2 + (c->d).size;
  abegin = std::
           __find_if<QList<QAbstractFileEngineHandler*>::const_iterator,__gnu_cxx::__ops::_Iter_equals_val<QAbstractFileEngineHandler*const>>
                     (ppQVar2,ppQVar1,t);
  if (abegin.i != ppQVar1) {
    QList<QAbstractFileEngineHandler_*>::erase(c,abegin,(const_iterator)(abegin.i + 1));
  }
  return abegin.i != ppQVar1;
}

Assistant:

auto sequential_erase_one(Container &c, const T &t)
{
    const auto cend = c.cend();
    const auto it = std::find(c.cbegin(), cend, t);
    if (it == cend)
        return false;
    c.erase(it);
    return true;
}